

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_cb0be::preprocessor<baryonyx::raw_problem>::try_remove_unused_variable
          (preprocessor<baryonyx::raw_problem> *this)

{
  byte bVar1;
  bool bVar2;
  pointer poVar3;
  mapped_type *pmVar4;
  bool local_61;
  __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_58;
  int local_4c;
  objective_function_element *local_48;
  __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_40;
  __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_38;
  __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  it;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> _Stack_28;
  bool value;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_20;
  int local_18;
  anon_class_4_1_54a39809_for__M_pred local_14;
  int e;
  int i;
  preprocessor<baryonyx::raw_problem> *this_local;
  
  local_14.i = 0;
  _e = this;
  local_18 = baryonyx::
             length<std::vector<(anonymous_namespace)::pp_variable_access,std::allocator<(anonymous_namespace)::pp_variable_access>>>
                       (&this->cache);
  for (; local_14.i != local_18; local_14.i = local_14.i + 1) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::find(&this->vars,&local_14.i);
    _Stack_28._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::end(&this->vars);
    bVar2 = std::__detail::operator==(&local_20,&stack0xffffffffffffffd8);
    local_61 = false;
    if (bVar2) {
      local_61 = is_unused_variable(this,local_14.i);
    }
    if (local_61 != false) {
      it._M_current._7_1_ = 1;
      local_40._M_current =
           (objective_function_element *)
           std::
           vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ::cbegin(&(this->pb->objective).elements);
      local_48 = (objective_function_element *)
                 std::
                 vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                 ::cend(&(this->pb->objective).elements);
      local_4c = local_14.i;
      local_38 = std::
                 find_if<__gnu_cxx::__normal_iterator<baryonyx::objective_function_element_const*,std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>,(anonymous_namespace)::preprocessor<baryonyx::raw_problem>::try_remove_unused_variable()::_lambda(auto:1_const&)_1_>
                           (local_40,(__normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                                      )local_48,local_14);
      local_58._M_current =
           (objective_function_element *)
           std::
           vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ::cend(&(this->pb->objective).elements);
      bVar2 = __gnu_cxx::
              operator==<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                        (&local_38,&local_58);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        if (this->pb->type == maximize) {
          poVar3 = __gnu_cxx::
                   __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                   ::operator->(&local_38);
          it._M_current._7_1_ = 0.0 < poVar3->factor;
        }
        else {
          poVar3 = __gnu_cxx::
                   __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                   ::operator->(&local_38);
          it._M_current._7_1_ = poVar3->factor < 0.0;
        }
      }
      bVar1 = it._M_current._7_1_;
      pmVar4 = std::
               unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
               ::operator[](&this->vars,&local_14.i);
      *pmVar4 = (mapped_type)(bVar1 & 1);
    }
  }
  return;
}

Assistant:

void try_remove_unused_variable()
    {
        for (int i = 0, e = bx::length(cache); i != e; ++i) {
            if (vars.find(i) == vars.end() && is_unused_variable(i)) {
                bool value = true;

                auto it = std::find_if(
                  pb.objective.elements.cbegin(),
                  pb.objective.elements.cend(),
                  [i](const auto& e) { return i == e.variable_index; });

                if (it != pb.objective.elements.cend()) {
                    if (pb.type == bx::objective_function_type::maximize) {
                        value = it->factor > 0;
                    } else {
                        value = it->factor < 0;
                    }
                }

                vars[i] = value;
            }
        }
    }